

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSDDOMParser::startAnnotationElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,RefVectorOf<xercesc_4_0::XMLAttr> *attrList,
          XMLSize_t attrCount)

{
  XMLBuffer *this_00;
  XMLCh *pXVar1;
  XMLAttr *this_01;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  XMLSize_t getAt;
  
  this_00 = &this->fAnnotationBuf;
  XVar2 = (this->fAnnotationBuf).fIndex;
  if (XVar2 == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar2 = this_00->fIndex;
  }
  (this->fAnnotationBuf).fIndex = XVar2 + 1;
  (this->fAnnotationBuf).fBuffer[XVar2] = L'<';
  pXVar1 = QName::getRawName(elemDecl->fElementName);
  XMLBuffer::append(this_00,pXVar1);
  if (attrCount == 0) {
    XVar2 = this_00->fIndex;
  }
  else {
    getAt = 0;
    do {
      this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      XVar2 = (this->fAnnotationBuf).fIndex;
      if (XVar2 == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar2 = this_00->fIndex;
      }
      (this->fAnnotationBuf).fIndex = XVar2 + 1;
      (this->fAnnotationBuf).fBuffer[XVar2] = L' ';
      pXVar1 = XMLAttr::getQName(this_01);
      XMLBuffer::append(this_00,pXVar1);
      XVar2 = (this->fAnnotationBuf).fIndex;
      XVar3 = (this->fAnnotationBuf).fCapacity;
      if (XVar2 == XVar3) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar2 = (this->fAnnotationBuf).fIndex;
        XVar3 = (this->fAnnotationBuf).fCapacity;
      }
      pXVar1 = (this->fAnnotationBuf).fBuffer;
      XVar4 = XVar2 + 1;
      (this->fAnnotationBuf).fIndex = XVar4;
      pXVar1[XVar2] = L'=';
      if (XVar4 == XVar3) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar4 = (this->fAnnotationBuf).fIndex;
        pXVar1 = (this->fAnnotationBuf).fBuffer;
      }
      (this->fAnnotationBuf).fIndex = XVar4 + 1;
      pXVar1[XVar4] = L'\"';
      XMLBuffer::append(this_00,this_01->fValue);
      XVar3 = (this->fAnnotationBuf).fIndex;
      if (XVar3 == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar3 = this_00->fIndex;
      }
      XVar2 = XVar3 + 1;
      (this->fAnnotationBuf).fIndex = XVar2;
      (this->fAnnotationBuf).fBuffer[XVar3] = L'\"';
      getAt = getAt + 1;
    } while (attrCount != getAt);
  }
  if (XVar2 == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar2 = this_00->fIndex;
  }
  (this->fAnnotationBuf).fIndex = XVar2 + 1;
  (this->fAnnotationBuf).fBuffer[XVar2] = L'>';
  return;
}

Assistant:

void XSDDOMParser::startAnnotationElement( const XMLElementDecl&       elemDecl
                                         , const RefVectorOf<XMLAttr>& attrList
                                         , const XMLSize_t             attrCount)
{
    fAnnotationBuf.append(chOpenAngle);
    fAnnotationBuf.append(elemDecl.getFullName());
    //fAnnotationBuf.append(chSpace);

    for(XMLSize_t i=0; i < attrCount; i++) {

        const XMLAttr* oneAttr = attrList.elementAt(i);
        fAnnotationBuf.append(chSpace);
        fAnnotationBuf.append(oneAttr ->getQName());
        fAnnotationBuf.append(chEqual);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(oneAttr->getValue());
        fAnnotationBuf.append(chDoubleQuote);
    }

    fAnnotationBuf.append(chCloseAngle);
}